

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void generate_exception(DisasContext_conflict12 *ctx,int excp)

{
  TCGContext_conflict11 *tcg_ctx;
  TCGv_i32 arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_movi_i64_riscv64(tcg_ctx,tcg_ctx->cpu_pc,(ctx->base).pc_next);
  arg2 = tcg_const_i32_riscv64(tcg_ctx,excp);
  gen_helper_raise_exception_riscv64(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static inline void generate_exception(DisasContext *ctx, int excp)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_0e0i(raise_exception, excp);
}